

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O0

BOOL __thiscall
Js::CrossSiteObject<Js::SpreadArgument>::SetItem
          (CrossSiteObject<Js::SpreadArgument> *this,uint32 index,Var value,
          PropertyOperationFlags flags)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  Var value_00;
  PropertyOperationFlags flags_local;
  Var value_local;
  uint32 index_local;
  CrossSiteObject<Js::SpreadArgument> *this_local;
  
  scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  value_00 = CrossSite::MarshalVar(scriptContext,value,false);
  BVar1 = SpreadArgument::SetItem(&this->super_SpreadArgument,index,value_00,flags);
  return BVar1;
}

Assistant:

BOOL CrossSiteObject<T>::SetItem(uint32 index, Var value, PropertyOperationFlags flags)
    {
        value = CrossSite::MarshalVar(this->GetScriptContext(), value);
        return __super::SetItem(index, value, flags);
    }